

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruckig.hpp
# Opt level: O3

Result __thiscall
ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::update
          (Ruckig<3UL,_ruckig::StandardVector,_false> *this,
          InputParameter<3UL,_ruckig::StandardVector> *input,
          OutputParameter<3UL,_ruckig::StandardVector> *output)

{
  pointer __src;
  double *pdVar1;
  ulong uVar2;
  pointer __dest;
  double dVar3;
  optional<double> *poVar4;
  undefined7 uVar5;
  bool bVar6;
  Result RVar7;
  long lVar8;
  long lVar9;
  pointer paVar10;
  optional<std::array<double,_3UL>_> *poVar11;
  optional<std::array<double,_3UL>_> *poVar12;
  byte bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  anon_class_32_4_098e0619 local_50;
  
  bVar13 = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  output->new_calculation = false;
  if ((this->current_input_initialized != true) ||
     (bVar6 = InputParameter<3UL,_ruckig::StandardVector>::operator!=(input,&this->current_input),
     bVar6)) {
    RVar7 = calculate(this,input,&output->trajectory,&output->was_calculation_interrupted);
    if ((RVar7 != Working) && (RVar7 != ErrorPositionalLimits)) {
      return RVar7;
    }
    memcpy(this,input,0x130);
    std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::operator=
              (&(this->current_input).intermediate_positions,&input->intermediate_positions);
    std::
    _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
    ::_M_copy_assign((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                      *)&(this->current_input).per_section_max_velocity,
                     (_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                      *)&input->per_section_max_velocity);
    std::
    _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
    ::_M_copy_assign((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                      *)&(this->current_input).per_section_max_acceleration,
                     (_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                      *)&input->per_section_max_acceleration);
    std::
    _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
    ::_M_copy_assign((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                      *)&(this->current_input).per_section_max_jerk,
                     (_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                      *)&input->per_section_max_jerk);
    std::
    _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
    ::_M_copy_assign((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                      *)&(this->current_input).per_section_min_velocity,
                     (_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                      *)&input->per_section_min_velocity);
    std::
    _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
    ::_M_copy_assign((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                      *)&(this->current_input).per_section_min_acceleration,
                     (_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                      *)&input->per_section_min_acceleration);
    std::
    _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
    ::_M_copy_assign((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                      *)&(this->current_input).per_section_max_position,
                     (_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                      *)&input->per_section_max_position);
    std::
    _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
    ::_M_copy_assign((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                      *)&(this->current_input).per_section_min_position,
                     (_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                      *)&input->per_section_min_position);
    poVar11 = &input->max_position;
    poVar12 = &(this->current_input).max_position;
    for (lVar9 = 0xf; lVar9 != 0; lVar9 = lVar9 + -1) {
      (poVar12->super__Optional_base<std::array<double,_3UL>,_true,_true>)._M_payload.
      super__Optional_payload_base<std::array<double,_3UL>_>._M_payload._M_value._M_elems[0] =
           (poVar11->super__Optional_base<std::array<double,_3UL>,_true,_true>)._M_payload.
           super__Optional_payload_base<std::array<double,_3UL>_>._M_payload._M_value._M_elems[0];
      poVar11 = (optional<std::array<double,_3UL>_> *)((long)poVar11 + (ulong)bVar13 * -0x10 + 8);
      poVar12 = (optional<std::array<double,_3UL>_> *)((long)poVar12 + (ulong)bVar13 * -0x10 + 8);
    }
    std::_Optional_payload_base<std::vector<double,_std::allocator<double>_>_>::_M_copy_assign
              ((_Optional_payload_base<std::vector<double,_std::allocator<double>_>_> *)
               &(this->current_input).per_section_minimum_duration,
               (_Optional_payload_base<std::vector<double,_std::allocator<double>_>_> *)
               &input->per_section_minimum_duration);
    bVar6 = (input->interrupt_calculation_duration).super__Optional_base<double,_true,_true>.
            _M_payload.super__Optional_payload_base<double>._M_engaged;
    uVar5 = *(undefined7 *)
             &(input->interrupt_calculation_duration).super__Optional_base<double,_true,_true>.
              _M_payload.super__Optional_payload_base<double>.field_0x9;
    (this->current_input).interrupt_calculation_duration.super__Optional_base<double,_true,_true>.
    _M_payload.super__Optional_payload_base<double>._M_payload =
         (input->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload
         .super__Optional_payload_base<double>._M_payload;
    poVar4 = &(this->current_input).interrupt_calculation_duration;
    (poVar4->super__Optional_base<double,_true,_true>)._M_payload.
    super__Optional_payload_base<double>._M_engaged = bVar6;
    *(undefined7 *)
     &(poVar4->super__Optional_base<double,_true,_true>)._M_payload.
      super__Optional_payload_base<double>.field_0x9 = uVar5;
    this->current_input_initialized = true;
    output->new_calculation = true;
    uVar14 = 0;
    uVar15 = 0;
  }
  else {
    uVar14 = SUB84(output->time,0);
    uVar15 = (undefined4)((ulong)output->time >> 0x20);
    RVar7 = Working;
  }
  dVar3 = (double)CONCAT44(uVar15,uVar14) + this->delta_time;
  uVar2 = output->new_section;
  output->time = dVar3;
  local_50.new_position = &output->new_position;
  local_50.new_velocity = &output->new_velocity;
  local_50.new_acceleration = &output->new_acceleration;
  local_50.new_jerk = &output->new_jerk;
  Trajectory<3ul,ruckig::StandardVector>::
  state_to_integrate_from<ruckig::Trajectory<3ul,ruckig::StandardVector>::at_time(double,std::array<double,3ul>&,std::array<double,3ul>&,std::array<double,3ul>&,std::array<double,3ul>&,unsigned_long&)const::_lambda(unsigned_long,double,double,double,double,double)_1_>
            ((Trajectory<3ul,ruckig::StandardVector> *)&output->trajectory,dVar3,
             &output->new_section,&local_50);
  output->did_section_change = uVar2 < output->new_section;
  lVar9 = std::chrono::_V2::steady_clock::now();
  output->calculation_duration = (double)(lVar9 - lVar8) / 1000.0;
  (this->current_input).current_position._M_elems[2] = (output->new_position)._M_elems[2];
  dVar3 = (output->new_position)._M_elems[1];
  (this->current_input).current_position._M_elems[0] = (output->new_position)._M_elems[0];
  (this->current_input).current_position._M_elems[1] = dVar3;
  (this->current_input).current_velocity._M_elems[2] = (output->new_velocity)._M_elems[2];
  dVar3 = (output->new_velocity)._M_elems[1];
  (this->current_input).current_velocity._M_elems[0] = (output->new_velocity)._M_elems[0];
  (this->current_input).current_velocity._M_elems[1] = dVar3;
  (this->current_input).current_acceleration._M_elems[2] = (output->new_acceleration)._M_elems[2];
  dVar3 = (output->new_acceleration)._M_elems[1];
  (this->current_input).current_acceleration._M_elems[0] = (output->new_acceleration)._M_elems[0];
  (this->current_input).current_acceleration._M_elems[1] = dVar3;
  if (output->did_section_change == true) {
    __dest = (this->current_input).intermediate_positions.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    paVar10 = (this->current_input).intermediate_positions.
              super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (__dest != paVar10) {
      __src = __dest + 1;
      if (__src != paVar10) {
        memmove(__dest,__src,(long)paVar10 - (long)__src);
        paVar10 = (this->current_input).intermediate_positions.
                  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      (this->current_input).intermediate_positions.
      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl
      .super__Vector_impl_data._M_finish = paVar10 + -1;
    }
  }
  pdVar1 = &(output->trajectory).duration;
  if (*pdVar1 <= output->time && output->time != *pdVar1) {
    RVar7 = Finished;
  }
  return RVar7;
}

Assistant:

Result update(const InputParameter<DOFs, CustomVector>& input, OutputParameter<DOFs, CustomVector>& output) {
        const auto start = std::chrono::steady_clock::now();

        if constexpr (DOFs == 0 && throw_error) {
            if (degrees_of_freedom != input.degrees_of_freedom || degrees_of_freedom != output.degrees_of_freedom) {
                throw RuckigError("mismatch in degrees of freedom (vector size).");
            }
        }

        output.new_calculation = false;

        Result result {Result::Working};
        if (!current_input_initialized || input != current_input) {
            result = calculate(input, output.trajectory, output.was_calculation_interrupted);
            if (result != Result::Working && result != Result::ErrorPositionalLimits) {
                return result;
            }

            current_input = input;
            current_input_initialized = true;
            output.time = 0.0;
            output.new_calculation = true;
        }

        const size_t old_section = output.new_section;
        output.time += delta_time;
        output.trajectory.at_time(output.time, output.new_position, output.new_velocity, output.new_acceleration, output.new_jerk, output.new_section);
        output.did_section_change = (output.new_section > old_section);  // Report only forward section changes

        const auto stop = std::chrono::steady_clock::now();
        output.calculation_duration = std::chrono::duration_cast<std::chrono::nanoseconds>(stop - start).count() / 1000.0;

        output.pass_to_input(current_input);

        if (output.time > output.trajectory.get_duration()) {
            return Result::Finished;
        }

        return result;
    }